

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void Assimp::Write(JSONWriter *out,aiMatrix4x4 *ai,bool is_elem)

{
  float *pfVar1;
  uint local_24;
  uint local_20;
  uint y;
  uint x;
  bool is_elem_local;
  aiMatrix4x4 *ai_local;
  JSONWriter *out_local;
  
  JSONWriter::StartArray(out,is_elem);
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      pfVar1 = aiMatrix4x4t<float>::operator[](ai,local_20);
      JSONWriter::Element<float>(out,pfVar1 + local_24);
    }
  }
  JSONWriter::EndArray(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiMatrix4x4& ai, bool is_elem = true) {
    out.StartArray(is_elem);
    for (unsigned int x = 0; x < 4; ++x) {
        for (unsigned int y = 0; y < 4; ++y) {
            out.Element(ai[x][y]);
        }
    }
    out.EndArray();
}